

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Type *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Enum EVar2;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  bool local_155;
  Type local_154;
  undefined1 auStack_150 [3];
  bool is_enabled;
  Type type;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string asStack_e8 [32];
  string asStack_c8 [32];
  string asStack_a8 [32];
  string asStack_88 [32];
  string asStack_68 [32];
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  Type *local_20;
  Type *out_type_local;
  WastParser *this_local;
  
  local_20 = out_type;
  out_type_local = (Type *)this;
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    Consume((Token *)auStack_150,this);
    local_154 = Token::type((Token *)auStack_150);
    EVar2 = Type::operator_cast_to_Enum(&local_154);
    if (EVar2 == ExnRef) {
      local_155 = Features::exceptions_enabled(&this->options_->features);
    }
    else if ((uint)(EVar2 + ~(ExnRef|I16U)) < 2) {
      local_155 = Features::reference_types_enabled(&this->options_->features);
    }
    else if (EVar2 == V128) {
      local_155 = Features::simd_enabled(&this->options_->features);
    }
    else {
      local_155 = true;
    }
    if (local_155 == false) {
      format = Type::GetName(&local_154);
      Error(this,0x4072d4,format);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_20->enum_ = local_154.enum_;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_108,"i32",
               (allocator *)((long)&token.field_2.literal_.text.size_ + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_e8,"i64",(allocator *)((long)&token.field_2.literal_.text.size_ + 6));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_c8,"f32",(allocator *)((long)&token.field_2.literal_.text.size_ + 5));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_a8,"f64",(allocator *)((long)&token.field_2.literal_.text.size_ + 4));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_88,"v128",(allocator *)((long)&token.field_2.literal_.text.size_ + 3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_68,"externref",(allocator *)((long)&token.field_2.literal_.text.size_ + 2));
    local_48 = &local_108;
    local_40 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text.size_ + 1));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text.size_ + 1));
    this_local._4_4_ = ErrorExpected(this,&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text.size_ + 1));
    local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_188 = local_188 + -1;
      std::__cxx11::string::~string((string *)local_188);
    } while (local_188 != &local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 2));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 3));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 4));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 5));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseValueType(Type* out_type) {
  WABT_TRACE(ParseValueType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"i32", "i64", "f32", "f64", "v128", "externref"});
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    case Type::ExnRef:
      is_enabled = options_->features.exceptions_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}